

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall leveldb::Arena::~Arena(Arena *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  ulong uVar3;
  
  ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar1 != ppcVar2) {
    uVar3 = 0;
    do {
      if (ppcVar2[uVar3] != (char *)0x0) {
        operator_delete__(ppcVar2[uVar3]);
        ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppcVar1 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)ppcVar1 - (long)ppcVar2 >> 3));
  }
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2);
    return;
  }
  return;
}

Assistant:

Arena::~Arena() {
  for (size_t i = 0; i < blocks_.size(); i++) {
    delete[] blocks_[i];
  }
}